

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::DecimalFormatSymbols::getPatternForCurrencySpacing
          (DecimalFormatSymbols *this,UCurrencySpacing type,UBool beforeCurrency,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return &this->fNoSymbol;
  }
  if (beforeCurrency != '\0') {
    return (UnicodeString *)(&this->field_0x978 + (long)(int)type * 0x40);
  }
  return (UnicodeString *)(&this->field_0xa38 + (long)(int)type * 0x40);
}

Assistant:

const UnicodeString&
DecimalFormatSymbols::getPatternForCurrencySpacing(UCurrencySpacing type,
                                                 UBool beforeCurrency,
                                                 UErrorCode& status) const {
    if (U_FAILURE(status)) {
      return fNoSymbol;  // always empty.
    }
    if (beforeCurrency) {
      return currencySpcBeforeSym[(int32_t)type];
    } else {
      return currencySpcAfterSym[(int32_t)type];
    }
}